

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZConsReader.cpp
# Opt level: O2

void __thiscall OpenMD::ZConsReader::ZConsReader(ZConsReader *this,SimInfo *info)

{
  Globals *pGVar1;
  pointer ppZVar2;
  pointer ppZVar3;
  ostream *poVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  vector<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_> stamp;
  string local_68;
  string zconsFileName_;
  
  std::ifstream::ifstream(this);
  this->info_ = info;
  (this->allZmols_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->allZmols_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->allZmols_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->fixedZmolData_).super__Vector_base<OpenMD::ZconsData,_std::allocator<OpenMD::ZconsData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->fixedZmolData_).super__Vector_base<OpenMD::ZconsData,_std::allocator<OpenMD::ZconsData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->fixedZmolData_).super__Vector_base<OpenMD::ZconsData,_std::allocator<OpenMD::ZconsData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_68,(string *)&info->finalConfigFileName_);
  getPrefix((string *)&stamp,&local_68);
  std::operator+(&zconsFileName_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stamp,".fz");
  std::__cxx11::string::~string((string *)&stamp);
  std::__cxx11::string::~string((string *)&local_68);
  std::ifstream::open((char *)this,(_Ios_Openmode)zconsFileName_._M_dataplus._M_p);
  if (((&this->field_0x20)[*(long *)(*(long *)this + -0x18)] & 5) == 0) {
    pGVar1 = this->info_->simParams_;
    ppZVar2 = (pGVar1->zconstraints_).
              super__Vector_base<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppZVar3 = (pGVar1->zconstraints_).
              super__Vector_base<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    std::vector<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>::vector
              (&stamp,&pGVar1->zconstraints_);
    uVar5 = (ulong)((long)ppZVar3 - (long)ppZVar2) >> 3;
    uVar7 = 0;
    uVar6 = uVar5 & 0xffffffff;
    if ((int)uVar5 < 1) {
      uVar6 = uVar7;
    }
    for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
      local_68._M_dataplus._M_p._0_4_ =
           *(undefined4 *)
            &(stamp.super__Vector_base<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar7]->MolIndex).super_ParameterBase.
             field_0x2c;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->allZmols_,(int *)&local_68);
    }
    std::_Vector_base<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>::~_Vector_base
              (&stamp.
                super__Vector_base<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>);
    std::__cxx11::string::~string((string *)&zconsFileName_);
    return;
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"open ");
  poVar4 = std::operator<<(poVar4,(string *)&zconsFileName_);
  poVar4 = std::operator<<(poVar4,"error");
  std::endl<char,std::char_traits<char>>(poVar4);
  exit(1);
}

Assistant:

ZConsReader::ZConsReader(SimInfo* info) : info_(info) {
    std::string zconsFileName_ =
        getPrefix(info_->getFinalConfigFileName()) + ".fz";
    istream_.open(zconsFileName_.c_str());

    if (!istream_) {
      std::cerr << "open " << zconsFileName_ << "error" << std::endl;
      exit(1);
    }

    Globals* simParam              = info_->getSimParams();
    int nZconstraints              = simParam->getNZconsStamps();
    std::vector<ZConsStamp*> stamp = simParam->getZconsStamps();
    for (int i = 0; i < nZconstraints; i++) {
      allZmols_.push_back(stamp[i]->getMolIndex());
    }
  }